

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O1

void __thiscall
QOpenGLShaderProgram::setUniformValue(QOpenGLShaderProgram *this,char *name,QSize *size)

{
  int location;
  
  location = uniformLocation(this,name);
  setUniformValue(this,location,size);
  return;
}

Assistant:

void QOpenGLShaderProgram::setUniformValue(const char *name, const QSize& size)
{
    setUniformValue(uniformLocation(name), size);
}